

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O0

void R_NewWall(bool needlights)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FTextureID texnum;
  sector_t *psVar5;
  FTexture *pFVar6;
  double dVar7;
  double dVar8;
  double local_f8;
  double local_e8;
  double local_d8;
  bool local_c9;
  bool local_aa;
  bool local_a9;
  bool local_98;
  bool local_97;
  bool local_96;
  bool local_95;
  bool local_82;
  bool local_81;
  FTexture *midtex;
  int local_58;
  int planeside;
  FTextureID local_50;
  FTextureID local_4c;
  FTextureID local_48;
  FTextureID local_44;
  FTextureID local_40;
  FTextureID local_3c;
  FTextureID local_38;
  FTextureID local_34;
  FTextureID local_30;
  FTextureID local_2c;
  FTextureID local_28;
  int local_24;
  double local_20;
  double yrepeat;
  double rowoffset;
  bool needlights_local;
  
  rw_markportal = false;
  sidedef = curline->sidedef;
  linedef = curline->linedef;
  if (!r_dontmaplines) {
    linedef->flags = linedef->flags | 0x100;
  }
  bottomtexture = (FTexture *)0x0;
  toptexture = (FTexture *)0x0;
  midtexture = (FTexture *)0x0;
  rowoffset._7_1_ = needlights;
  if (((sidedef == linedef->sidedef[0]) && (linedef->special == 0xb6)) &&
     (bVar1 = FBoolCVar::operator_cast_to_bool(&r_drawmirrors), bVar1)) {
    markceiling = true;
    markfloor = true;
    rw_markportal = true;
    goto LAB_003a168b;
  }
  if (backsector == (sector_t *)0x0) {
    markceiling = true;
    markfloor = true;
    bVar1 = line_t::isVisualPortal(linedef);
    if (bVar1) {
      rw_markportal = true;
    }
    else if (linedef->special != 9) {
      local_24 = (int)side_t::GetTexture(sidedef,1);
      midtexture = FTextureManager::operator()(&TexMan,(FTextureID)local_24,true);
      dVar7 = side_t::GetTextureXOffset(sidedef,1);
      rw_offset_mid = FloatToFixed(dVar7);
      yrepeat = side_t::GetTextureYOffset(sidedef,1);
      rw_midtexturescalex = side_t::GetTextureXScale(sidedef,1);
      rw_midtexturescaley = side_t::GetTextureYScale(sidedef,1);
      local_20 = (midtexture->Scale).Y * rw_midtexturescaley;
      if (local_20 < 0.0) {
        yrepeat = -yrepeat;
        if ((linedef->flags & 0x10) == 0) {
          dVar7 = sector_t::GetPlaneTexZ(frontsector,1);
          dVar7 = (dVar7 - ViewPos.Z) * local_20;
          iVar2 = FTexture::GetHeight(midtexture);
          rw_midtexturemid = dVar7 + (double)iVar2;
        }
        else {
          dVar7 = sector_t::GetPlaneTexZ(frontsector,0);
          rw_midtexturemid = (dVar7 - ViewPos.Z) * local_20;
        }
      }
      else if ((linedef->flags & 0x10) == 0) {
        dVar7 = sector_t::GetPlaneTexZ(frontsector,1);
        rw_midtexturemid = (dVar7 - ViewPos.Z) * local_20;
        if ((yrepeat < 0.0) && (midtexture != (FTexture *)0x0)) {
          iVar2 = FTexture::GetHeight(midtexture);
          yrepeat = (double)iVar2 + yrepeat;
        }
      }
      else {
        dVar7 = sector_t::GetPlaneTexZ(frontsector,0);
        dVar7 = (dVar7 - ViewPos.Z) * local_20;
        iVar2 = FTexture::GetHeight(midtexture);
        rw_midtexturemid = dVar7 + (double)iVar2;
      }
      dVar7 = yrepeat;
      if ((*(ushort *)&midtexture->field_0x31 >> 2 & 1) != 0) {
        dVar7 = yrepeat * local_20;
      }
      rw_midtexturemid = dVar7 + rw_midtexturemid;
    }
    goto LAB_003a168b;
  }
  rw_frontlowertop = sector_t::GetPlaneTexZ(frontsector,1);
  local_28 = sector_t::GetTexture(frontsector,1);
  bVar1 = FTextureID::operator==(&local_28,&skyflatnum);
  local_81 = false;
  if (bVar1) {
    local_2c = sector_t::GetTexture(backsector,1);
    local_81 = FTextureID::operator==(&local_2c,&skyflatnum);
  }
  if (local_81 != false) {
    if ((rw_havehigh & 1U) == 0) {
      if (((rw_havelow & 1U) != 0) &&
         (bVar1 = secplane_t::operator!=(&frontsector->ceilingplane,&backsector->ceilingplane),
         bVar1)) {
        WallMost(walltop,&backsector->ceilingplane,&WallC);
      }
    }
    else {
      memcpy(walltop + WallC.sx1,wallupper + WallC.sx1,(long)((int)WallC.sx2 - (int)WallC.sx1) << 1)
      ;
      rw_havehigh = false;
    }
    rw_frontlowertop = sector_t::GetPlaneTexZ(backsector,1);
  }
  bVar1 = line_t::isVisualPortal(linedef);
  if (bVar1) {
    markfloor = true;
    markceiling = true;
  }
  else if (((rw_backcz1 <= rw_frontfz1) && (rw_backcz2 <= rw_frontfz2)) ||
          ((rw_frontcz1 <= rw_backfz1 && (rw_frontcz2 <= rw_backfz2)))) {
    markfloor = true;
    markceiling = true;
  }
  else {
    local_82 = true;
    if ((rw_mustmarkfloor & 1U) == 0) {
      bVar1 = secplane_t::operator!=(&backsector->floorplane,&frontsector->floorplane);
      local_82 = true;
      if ((!bVar1) && (local_82 = true, backsector->lightlevel == frontsector->lightlevel)) {
        local_30 = sector_t::GetTexture(backsector,0);
        local_34 = sector_t::GetTexture(frontsector,0);
        bVar1 = FTextureID::operator!=(&local_30,&local_34);
        local_82 = true;
        if (!bVar1) {
          iVar2 = sector_t::GetPlaneLight(backsector,0);
          iVar3 = sector_t::GetPlaneLight(frontsector,0);
          local_82 = true;
          if (iVar2 == iVar3) {
            bVar1 = FTransform::operator!=((FTransform *)backsector,(FTransform *)frontsector);
            local_82 = true;
            if (!bVar1) {
              dVar7 = sector_t::GetAlpha(backsector,0);
              dVar8 = sector_t::GetAlpha(frontsector,0);
              local_82 = true;
              if (((dVar7 == dVar8) && (!NAN(dVar7) && !NAN(dVar8))) &&
                 (local_82 = true, frontsector->heightsec == (sector_t *)0x0)) {
                iVar2 = sector_t::GetVisFlags(backsector,0);
                iVar3 = sector_t::GetVisFlags(frontsector,0);
                local_82 = true;
                if ((iVar2 == iVar3) &&
                   (local_82 = true, backsector->ColorMap == frontsector->ColorMap)) {
                  if (frontsector->e != (extsector_t *)0x0) {
                    uVar4 = TArray<lightlist_t,_lightlist_t>::Size
                                      (&(frontsector->e->XFloor).lightlist);
                    local_82 = true;
                    if (uVar4 != 0) goto LAB_003a0d79;
                  }
                  if (backsector->e != (extsector_t *)0x0) {
                    uVar4 = TArray<lightlist_t,_lightlist_t>::Size
                                      (&(backsector->e->XFloor).lightlist);
                    local_82 = true;
                    if (uVar4 != 0) goto LAB_003a0d79;
                  }
                  local_38 = side_t::GetTexture(sidedef,1);
                  bVar1 = FTextureID::isValid(&local_38);
                  local_95 = false;
                  if (bVar1) {
                    local_96 = true;
                    if ((linedef->flags & 0x180000) == 0) {
                      local_96 = (sidedef->Flags & 0x30) != 0;
                    }
                    local_95 = local_96;
                  }
                  local_82 = local_95;
                }
              }
            }
          }
        }
      }
    }
LAB_003a0d79:
    markfloor = local_82;
    local_3c = sector_t::GetTexture(frontsector,1);
    bVar1 = FTextureID::operator!=(&local_3c,&skyflatnum);
    if (bVar1) {
LAB_003a0dea:
      local_98 = true;
      if ((rw_mustmarkceiling & 1U) == 0) {
        bVar1 = secplane_t::operator!=(&backsector->ceilingplane,&frontsector->ceilingplane);
        local_98 = true;
        if ((!bVar1) && (local_98 = true, backsector->lightlevel == frontsector->lightlevel)) {
          local_44 = sector_t::GetTexture(backsector,1);
          local_48 = sector_t::GetTexture(frontsector,1);
          bVar1 = FTextureID::operator!=(&local_44,&local_48);
          local_98 = true;
          if (!bVar1) {
            bVar1 = FTransform::operator!=
                              (&backsector->planes[1].xform,&frontsector->planes[1].xform);
            local_98 = true;
            if (!bVar1) {
              dVar7 = sector_t::GetAlpha(backsector,1);
              dVar8 = sector_t::GetAlpha(frontsector,1);
              local_98 = true;
              if ((dVar7 == dVar8) && (!NAN(dVar7) && !NAN(dVar8))) {
                if (frontsector->heightsec != (sector_t *)0x0) {
                  local_4c = sector_t::GetTexture(frontsector,1);
                  bVar1 = FTextureID::operator!=(&local_4c,&skyflatnum);
                  local_98 = true;
                  if (bVar1) goto LAB_003a115d;
                }
                iVar2 = sector_t::GetPlaneLight(backsector,1);
                iVar3 = sector_t::GetPlaneLight(frontsector,1);
                local_98 = true;
                if (iVar2 == iVar3) {
                  iVar2 = sector_t::GetFlags(backsector,1);
                  iVar3 = sector_t::GetFlags(frontsector,1);
                  local_98 = true;
                  if ((iVar2 == iVar3) &&
                     (local_98 = true, backsector->ColorMap == frontsector->ColorMap)) {
                    if (frontsector->e != (extsector_t *)0x0) {
                      uVar4 = TArray<lightlist_t,_lightlist_t>::Size
                                        (&(frontsector->e->XFloor).lightlist);
                      local_98 = true;
                      if (uVar4 != 0) goto LAB_003a115d;
                    }
                    if (backsector->e != (extsector_t *)0x0) {
                      uVar4 = TArray<lightlist_t,_lightlist_t>::Size
                                        (&(backsector->e->XFloor).lightlist);
                      local_98 = true;
                      if (uVar4 != 0) goto LAB_003a115d;
                    }
                    local_50 = side_t::GetTexture(sidedef,1);
                    bVar1 = FTextureID::isValid(&local_50);
                    local_a9 = false;
                    if (bVar1) {
                      local_aa = true;
                      if ((linedef->flags & 0x180000) == 0) {
                        local_aa = (sidedef->Flags & 0x30) != 0;
                      }
                      local_a9 = local_aa;
                    }
                    local_98 = local_a9;
                  }
                }
              }
            }
          }
        }
      }
LAB_003a115d:
      local_97 = local_98;
    }
    else {
      local_40 = sector_t::GetTexture(backsector,1);
      bVar1 = FTextureID::operator!=(&local_40,&skyflatnum);
      local_97 = false;
      if (bVar1) goto LAB_003a0dea;
    }
    markceiling = local_97;
  }
  if ((rw_havehigh & 1U) != 0) {
    planeside = (int)side_t::GetTexture(sidedef,0);
    toptexture = FTextureManager::operator()(&TexMan,(FTextureID)planeside,true);
    dVar7 = side_t::GetTextureXOffset(sidedef,0);
    rw_offset_top = FloatToFixed(dVar7);
    yrepeat = side_t::GetTextureYOffset(sidedef,0);
    rw_toptexturescalex = side_t::GetTextureXScale(sidedef,0);
    rw_toptexturescaley = side_t::GetTextureYScale(sidedef,0);
    local_20 = (toptexture->Scale).Y * rw_toptexturescaley;
    if (local_20 < 0.0) {
      yrepeat = -yrepeat;
      if ((linedef->flags & 8) == 0) {
        dVar7 = sector_t::GetPlaneTexZ(backsector,1);
        rw_toptexturemid = (dVar7 - ViewPos.Z) * local_20;
      }
      else {
        dVar7 = sector_t::GetPlaneTexZ(frontsector,1);
        dVar7 = (dVar7 - ViewPos.Z) * local_20;
        iVar2 = FTexture::GetHeight(toptexture);
        rw_toptexturemid = dVar7 + (double)iVar2;
      }
    }
    else if ((linedef->flags & 8) == 0) {
      dVar7 = sector_t::GetPlaneTexZ(backsector,1);
      dVar7 = (dVar7 - ViewPos.Z) * local_20;
      iVar2 = FTexture::GetHeight(toptexture);
      rw_toptexturemid = dVar7 + (double)iVar2;
    }
    else {
      dVar7 = sector_t::GetPlaneTexZ(frontsector,1);
      rw_toptexturemid = (dVar7 - ViewPos.Z) * local_20;
      if ((yrepeat < 0.0) && (toptexture != (FTexture *)0x0)) {
        iVar2 = FTexture::GetHeight(toptexture);
        yrepeat = (double)iVar2 + yrepeat;
      }
    }
    dVar7 = yrepeat;
    if ((*(ushort *)&toptexture->field_0x31 >> 2 & 1) != 0) {
      dVar7 = yrepeat * local_20;
    }
    rw_toptexturemid = dVar7 + rw_toptexturemid;
  }
  if ((rw_havelow & 1U) != 0) {
    local_58 = (int)side_t::GetTexture(sidedef,2);
    bottomtexture = FTextureManager::operator()(&TexMan,(FTextureID)local_58,true);
    dVar7 = side_t::GetTextureXOffset(sidedef,2);
    rw_offset_bottom = FloatToFixed(dVar7);
    yrepeat = side_t::GetTextureYOffset(sidedef,2);
    rw_bottomtexturescalex = side_t::GetTextureXScale(sidedef,2);
    rw_bottomtexturescaley = side_t::GetTextureYScale(sidedef,2);
    local_20 = (bottomtexture->Scale).Y * rw_bottomtexturescaley;
    if (local_20 < 0.0) {
      yrepeat = -yrepeat;
      if ((linedef->flags & 0x10) == 0) {
        dVar7 = sector_t::GetPlaneTexZ(backsector,0);
        dVar7 = (dVar7 - ViewPos.Z) * local_20;
        iVar2 = FTexture::GetHeight(bottomtexture);
        rw_bottomtexturemid = dVar7 + (double)iVar2;
      }
      else {
        rw_bottomtexturemid = (rw_frontlowertop - ViewPos.Z) * local_20;
      }
    }
    else if ((linedef->flags & 0x10) == 0) {
      dVar7 = sector_t::GetPlaneTexZ(backsector,0);
      rw_bottomtexturemid = (dVar7 - ViewPos.Z) * local_20;
      if ((yrepeat < 0.0) && (bottomtexture != (FTexture *)0x0)) {
        iVar2 = FTexture::GetHeight(bottomtexture);
        yrepeat = (double)iVar2 + yrepeat;
      }
    }
    else {
      rw_bottomtexturemid = (rw_frontlowertop - ViewPos.Z) * local_20;
    }
    dVar7 = yrepeat;
    if ((*(ushort *)&bottomtexture->field_0x31 >> 2 & 1) != 0) {
      dVar7 = yrepeat * local_20;
    }
    rw_bottomtexturemid = dVar7 + rw_bottomtexturemid;
  }
  rw_markportal = line_t::isVisualPortal(linedef);
LAB_003a168b:
  psVar5 = sector_t::GetHeightSec(frontsector);
  if (psVar5 == (sector_t *)0x0) {
    midtex._4_4_ = secplane_t::PointOnSide(&frontsector->floorplane,&ViewPos);
    dVar7 = secplane_t::fC(&frontsector->floorplane);
    if (dVar7 < 0.0) {
      midtex._4_4_ = -midtex._4_4_;
    }
    if (midtex._4_4_ < 1) {
      markfloor = false;
    }
    midtex._0_4_ = sector_t::GetTexture(frontsector,1);
    bVar1 = FTextureID::operator!=((FTextureID *)&midtex,&skyflatnum);
    if (bVar1) {
      midtex._4_4_ = secplane_t::PointOnSide(&frontsector->ceilingplane,&ViewPos);
      dVar7 = secplane_t::fC(&frontsector->ceilingplane);
      if (0.0 < dVar7) {
        midtex._4_4_ = -midtex._4_4_;
      }
      if (midtex._4_4_ < 1) {
        markceiling = false;
      }
    }
  }
  texnum = side_t::GetTexture(sidedef,1);
  pFVar6 = FTextureManager::operator()(&TexMan,texnum,true);
  local_c9 = true;
  if ((pFVar6 == (FTexture *)0x0) && (local_c9 = true, toptexture == (FTexture *)0x0)) {
    local_c9 = bottomtexture != (FTexture *)0x0;
  }
  segtextured = local_c9;
  if (((rowoffset._7_1_ & 1) != 0) &&
     ((local_c9 != false ||
      ((backsector != (sector_t *)0x0 && (bVar1 = IsFogBoundary(frontsector,backsector), bVar1))))))
  {
    if (pFVar6 == (FTexture *)0x0) {
      if (toptexture == (FTexture *)0x0) {
        if (bottomtexture == (FTexture *)0x0) {
          local_f8 = 1.0;
        }
        else {
          local_f8 = (bottomtexture->Scale).X;
          dVar7 = side_t::GetTextureXScale(sidedef,2);
          local_f8 = local_f8 * dVar7;
        }
        local_e8 = local_f8;
      }
      else {
        local_e8 = (toptexture->Scale).X;
        dVar7 = side_t::GetTextureXScale(sidedef,0);
        local_e8 = local_e8 * dVar7;
      }
      local_d8 = local_e8;
    }
    else {
      local_d8 = (pFVar6->Scale).X;
      dVar7 = side_t::GetTextureXScale(sidedef,1);
      local_d8 = local_d8 * dVar7;
    }
    lwallscale = local_d8;
    PrepWall(swall,lwall,(double)sidedef->TexelLength * local_d8,(int)WallC.sx1,(int)WallC.sx2);
    if ((fixedcolormap == (lighttable_t *)0x0) && (fixedlightlev < 0)) {
      iVar2 = side_t::GetLightLevel
                        (curline->sidedef,(bool)(foggy & 1),(int)frontsector->lightlevel,false,
                         (int *)0x0);
      wallshade = (iVar2 + r_actualextralight + 0xc) * -0x4000 + 0x400000;
      GlobVis = r_WallVisibility;
      rw_lightleft = (float)(r_WallVisibility / (double)WallC.sz1);
      rw_lightstep = (float)((r_WallVisibility / (double)WallC.sz2 - (double)rw_lightleft) /
                            (double)((int)WallC.sx2 - (int)WallC.sx1));
    }
    else {
      rw_lightleft = 1.0;
      rw_lightstep = 0.0;
    }
  }
  return;
}

Assistant:

void R_NewWall (bool needlights)
{
	double rowoffset;
	double yrepeat;

	rw_markportal = false;

	sidedef = curline->sidedef;
	linedef = curline->linedef;

	// mark the segment as visible for auto map
	if (!r_dontmaplines) linedef->flags |= ML_MAPPED;

	midtexture = toptexture = bottomtexture = 0;

	if (sidedef == linedef->sidedef[0] &&
		(linedef->special == Line_Mirror && r_drawmirrors)) // [ZZ] compatibility with r_drawmirrors cvar that existed way before portals
	{
		markfloor = markceiling = true; // act like a one-sided wall here (todo: check how does this work with transparency)
		rw_markportal = true;
	}
	else if (backsector == NULL)
	{
		// single sided line
		// a single sided line is terminal, so it must mark ends
		markfloor = markceiling = true;
		// [RH] Horizon lines do not need to be textured
		if (linedef->isVisualPortal())
		{
			rw_markportal = true;
		}
		else if (linedef->special != Line_Horizon)
		{
			midtexture = TexMan(sidedef->GetTexture(side_t::mid), true);
			rw_offset_mid = FLOAT2FIXED(sidedef->GetTextureXOffset(side_t::mid));
			rowoffset = sidedef->GetTextureYOffset(side_t::mid);
			rw_midtexturescalex = sidedef->GetTextureXScale(side_t::mid);
			rw_midtexturescaley = sidedef->GetTextureYScale(side_t::mid);
			yrepeat = midtexture->Scale.Y * rw_midtexturescaley;
			if (yrepeat >= 0)
			{ // normal orientation
				if (linedef->flags & ML_DONTPEGBOTTOM)
				{ // bottom of texture at bottom
					rw_midtexturemid = (frontsector->GetPlaneTexZ(sector_t::floor) - ViewPos.Z) * yrepeat + midtexture->GetHeight();
				}
				else
				{ // top of texture at top
					rw_midtexturemid = (frontsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat;
					if (rowoffset < 0 && midtexture != NULL)
					{
						rowoffset += midtexture->GetHeight();
					}
				}
			}
			else
			{ // upside down
				rowoffset = -rowoffset;
				if (linedef->flags & ML_DONTPEGBOTTOM)
				{ // top of texture at bottom
					rw_midtexturemid = (frontsector->GetPlaneTexZ(sector_t::floor) - ViewPos.Z) * yrepeat;
				}
				else
				{ // bottom of texture at top
					rw_midtexturemid = (frontsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat + midtexture->GetHeight();
				}
			}
			if (midtexture->bWorldPanning)
			{
				rw_midtexturemid += rowoffset * yrepeat;
			}
			else
			{
				// rowoffset is added outside the multiply so that it positions the texture
				// by texels instead of world units.
				rw_midtexturemid += rowoffset;
			}
		}
	}
	else
	{ // two-sided line
		// hack to allow height changes in outdoor areas

		rw_frontlowertop = frontsector->GetPlaneTexZ(sector_t::ceiling);

		if (frontsector->GetTexture(sector_t::ceiling) == skyflatnum &&
			backsector->GetTexture(sector_t::ceiling) == skyflatnum)
		{
			if (rw_havehigh)
			{ // front ceiling is above back ceiling
				memcpy (&walltop[WallC.sx1], &wallupper[WallC.sx1], (WallC.sx2 - WallC.sx1)*sizeof(walltop[0]));
				rw_havehigh = false;
			}
			else if (rw_havelow && frontsector->ceilingplane != backsector->ceilingplane)
			{ // back ceiling is above front ceiling
				// The check for rw_havelow is not Doom-compliant, but it avoids HoM that
				// would otherwise occur because there is space made available for this
				// wall but nothing to draw for it.
				// Recalculate walltop so that the wall is clipped by the back sector's
				// ceiling instead of the front sector's ceiling.
				WallMost (walltop, backsector->ceilingplane, &WallC);
			}
			// Putting sky ceilings on the front and back of a line alters the way unpegged
			// positioning works.
			rw_frontlowertop = backsector->GetPlaneTexZ(sector_t::ceiling);
		}

		if (linedef->isVisualPortal())
		{
			markceiling = markfloor = true;
		}
		else if ((rw_backcz1 <= rw_frontfz1 && rw_backcz2 <= rw_frontfz2) ||
				 (rw_backfz1 >= rw_frontcz1 && rw_backfz2 >= rw_frontcz2))
		{
			// closed door
			markceiling = markfloor = true;
		}
		else
		{
			markfloor = rw_mustmarkfloor
				|| backsector->floorplane != frontsector->floorplane
				|| backsector->lightlevel != frontsector->lightlevel
				|| backsector->GetTexture(sector_t::floor) != frontsector->GetTexture(sector_t::floor)
				|| backsector->GetPlaneLight(sector_t::floor) != frontsector->GetPlaneLight(sector_t::floor)

				// killough 3/7/98: Add checks for (x,y) offsets
				|| backsector->planes[sector_t::floor].xform != frontsector->planes[sector_t::floor].xform
				|| backsector->GetAlpha(sector_t::floor) != frontsector->GetAlpha(sector_t::floor)

				// killough 4/15/98: prevent 2s normals
				// from bleeding through deep water
				|| frontsector->heightsec

				|| backsector->GetVisFlags(sector_t::floor) != frontsector->GetVisFlags(sector_t::floor)

				// [RH] Add checks for colormaps
				|| backsector->ColorMap != frontsector->ColorMap


				// kg3D - add fake lights
				|| (frontsector->e && frontsector->e->XFloor.lightlist.Size())
				|| (backsector->e && backsector->e->XFloor.lightlist.Size())

				|| (sidedef->GetTexture(side_t::mid).isValid() &&
					((linedef->flags & (ML_CLIP_MIDTEX|ML_WRAP_MIDTEX)) ||
					 (sidedef->Flags & (WALLF_CLIP_MIDTEX|WALLF_WRAP_MIDTEX))))
				;

			markceiling = (frontsector->GetTexture(sector_t::ceiling) != skyflatnum ||
				backsector->GetTexture(sector_t::ceiling) != skyflatnum) &&
				(rw_mustmarkceiling
				|| backsector->ceilingplane != frontsector->ceilingplane
				|| backsector->lightlevel != frontsector->lightlevel
				|| backsector->GetTexture(sector_t::ceiling) != frontsector->GetTexture(sector_t::ceiling)

				// killough 3/7/98: Add checks for (x,y) offsets
				|| backsector->planes[sector_t::ceiling].xform != frontsector->planes[sector_t::ceiling].xform
				|| backsector->GetAlpha(sector_t::ceiling) != frontsector->GetAlpha(sector_t::ceiling)

				// killough 4/15/98: prevent 2s normals
				// from bleeding through fake ceilings
				|| (frontsector->heightsec && frontsector->GetTexture(sector_t::ceiling) != skyflatnum)

				|| backsector->GetPlaneLight(sector_t::ceiling) != frontsector->GetPlaneLight(sector_t::ceiling)
				|| backsector->GetFlags(sector_t::ceiling) != frontsector->GetFlags(sector_t::ceiling)

				// [RH] Add check for colormaps
				|| backsector->ColorMap != frontsector->ColorMap

				// kg3D - add fake lights
				|| (frontsector->e && frontsector->e->XFloor.lightlist.Size())
				|| (backsector->e && backsector->e->XFloor.lightlist.Size())

				|| (sidedef->GetTexture(side_t::mid).isValid() &&
					((linedef->flags & (ML_CLIP_MIDTEX|ML_WRAP_MIDTEX)) ||
					(sidedef->Flags & (WALLF_CLIP_MIDTEX|WALLF_WRAP_MIDTEX))))
				);
		}

		if (rw_havehigh)
		{ // top texture
			toptexture = TexMan(sidedef->GetTexture(side_t::top), true);

			rw_offset_top = FLOAT2FIXED(sidedef->GetTextureXOffset(side_t::top));
			rowoffset = sidedef->GetTextureYOffset(side_t::top);
			rw_toptexturescalex =sidedef->GetTextureXScale(side_t::top);
			rw_toptexturescaley =sidedef->GetTextureYScale(side_t::top);
			yrepeat = toptexture->Scale.Y * rw_toptexturescaley;
			if (yrepeat >= 0)
			{ // normal orientation
				if (linedef->flags & ML_DONTPEGTOP)
				{ // top of texture at top
					rw_toptexturemid = (frontsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat;
					if (rowoffset < 0 && toptexture != NULL)
					{
						rowoffset += toptexture->GetHeight();
					}
				}
				else
				{ // bottom of texture at bottom
					rw_toptexturemid = (backsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat + toptexture->GetHeight();
				}
			}
			else
			{ // upside down
				rowoffset = -rowoffset;
				if (linedef->flags & ML_DONTPEGTOP)
				{ // bottom of texture at top
					rw_toptexturemid = (frontsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat + toptexture->GetHeight();
				}
				else
				{ // top of texture at bottom
					rw_toptexturemid = (backsector->GetPlaneTexZ(sector_t::ceiling) - ViewPos.Z) * yrepeat;
				}
			}
			if (toptexture->bWorldPanning)
			{
				rw_toptexturemid += rowoffset * yrepeat;
			}
			else
			{
				rw_toptexturemid += rowoffset;
			}
		}
		if (rw_havelow)
		{ // bottom texture
			bottomtexture = TexMan(sidedef->GetTexture(side_t::bottom), true);

			rw_offset_bottom = FLOAT2FIXED(sidedef->GetTextureXOffset(side_t::bottom));
			rowoffset = sidedef->GetTextureYOffset(side_t::bottom);
			rw_bottomtexturescalex = sidedef->GetTextureXScale(side_t::bottom);
			rw_bottomtexturescaley = sidedef->GetTextureYScale(side_t::bottom);
			yrepeat = bottomtexture->Scale.Y * rw_bottomtexturescaley;
			if (yrepeat >= 0)
			{ // normal orientation
				if (linedef->flags & ML_DONTPEGBOTTOM)
				{ // bottom of texture at bottom
					rw_bottomtexturemid = (rw_frontlowertop - ViewPos.Z) * yrepeat;
				}
				else
				{ // top of texture at top
					rw_bottomtexturemid = (backsector->GetPlaneTexZ(sector_t::floor) - ViewPos.Z) * yrepeat;
					if (rowoffset < 0 && bottomtexture != NULL)
					{
						rowoffset += bottomtexture->GetHeight();
					}
				}
			}
			else
			{ // upside down
				rowoffset = -rowoffset;
				if (linedef->flags & ML_DONTPEGBOTTOM)
				{ // top of texture at bottom
					rw_bottomtexturemid = (rw_frontlowertop - ViewPos.Z) * yrepeat;
				}
				else
				{ // bottom of texture at top
					rw_bottomtexturemid = (backsector->GetPlaneTexZ(sector_t::floor) - ViewPos.Z) * yrepeat + bottomtexture->GetHeight();
				}
			}
			if (bottomtexture->bWorldPanning)
			{
				rw_bottomtexturemid += rowoffset * yrepeat;
			}
			else
			{
				rw_bottomtexturemid += rowoffset;
			}
		}
		rw_markportal = linedef->isVisualPortal();
	}

	// if a floor / ceiling plane is on the wrong side of the view plane,
	// it is definitely invisible and doesn't need to be marked.

	// killough 3/7/98: add deep water check
	if (frontsector->GetHeightSec() == NULL)
	{
		int planeside;

		planeside = frontsector->floorplane.PointOnSide(ViewPos);
		if (frontsector->floorplane.fC() < 0)	// 3D floors have the floor backwards
			planeside = -planeside;
		if (planeside <= 0)		// above view plane
			markfloor = false;

		if (frontsector->GetTexture(sector_t::ceiling) != skyflatnum)
		{
			planeside = frontsector->ceilingplane.PointOnSide(ViewPos);
			if (frontsector->ceilingplane.fC() > 0)	// 3D floors have the ceiling backwards
				planeside = -planeside;
			if (planeside <= 0)		// below view plane
				markceiling = false;
		}
	}

	FTexture *midtex = TexMan(sidedef->GetTexture(side_t::mid), true);

	segtextured = midtex != NULL || toptexture != NULL || bottomtexture != NULL;

	// calculate light table
	if (needlights && (segtextured || (backsector && IsFogBoundary(frontsector, backsector))))
	{
		lwallscale =
			midtex ? (midtex->Scale.X * sidedef->GetTextureXScale(side_t::mid)) :
			toptexture ? (toptexture->Scale.X * sidedef->GetTextureXScale(side_t::top)) :
			bottomtexture ? (bottomtexture->Scale.X * sidedef->GetTextureXScale(side_t::bottom)) :
			1.;

		PrepWall (swall, lwall, sidedef->TexelLength * lwallscale, WallC.sx1, WallC.sx2);

		if (fixedcolormap == NULL && fixedlightlev < 0)
		{
			wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, frontsector->lightlevel)
				+ r_actualextralight);
			GlobVis = r_WallVisibility;
			rw_lightleft = float (GlobVis / WallC.sz1);
			rw_lightstep = float((GlobVis / WallC.sz2 - rw_lightleft) / (WallC.sx2 - WallC.sx1));
		}
		else
		{
			rw_lightleft = 1;
			rw_lightstep = 0;
		}
	}
}